

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

bool __thiscall UnifiedRegex::Node::IsBoundedWord(Node *this,Compiler *compiler)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  CharSet<char16_t> *other;
  
  if (((((this->tag == Concat) && (*(short *)(this[1]._vptr_Node + 1) == 3)) &&
       (lVar1 = *(long *)&this[1].tag, lVar1 != 0)) &&
      ((((lVar2 = *(long *)(lVar1 + 0x38), *(short *)(lVar2 + 8) == 10 &&
         (lVar1 = *(long *)(lVar1 + 0x40), lVar1 != 0)) &&
        ((*(short *)(*(long *)(lVar1 + 0x38) + 8) == 3 &&
         ((*(long *)(lVar1 + 0x40) == 0 && (*(char *)(this[1]._vptr_Node + 7) == '\0')))))) &&
       (*(char *)(lVar2 + 0x4a) == '\x01')))) &&
     ((((*(int *)(lVar2 + 0x40) == 1 && (*(int *)(lVar2 + 0x44) == -1)) &&
       (lVar2 = *(long *)(lVar2 + 0x38), *(short *)(lVar2 + 8) == 0xb)) &&
      ((*(char *)(*(long *)(lVar1 + 0x38) + 0x38) == '\0' && (*(char *)(lVar2 + 0x38) == '\0'))))))
  {
    other = StandardChars<char16_t>::GetWordSet(compiler->standardChars);
    bVar3 = CharSet<char16_t>::IsEqualTo((CharSet<char16_t> *)(lVar2 + 0x40),other);
    return bVar3;
  }
  return false;
}

Assistant:

bool Node::IsBoundedWord(Compiler& compiler) const
    {
        if (tag != Node::Concat)
            return false;

        const ConcatNode* concatNode = (const ConcatNode *)this;
        if (concatNode->head->tag != Node::WordBoundary ||
            concatNode->tail == 0 ||
            concatNode->tail->head->tag != Node::Loop ||
            concatNode->tail->tail == 0 ||
            concatNode->tail->tail->head->tag != Node::WordBoundary ||
            concatNode->tail->tail->tail != 0)
            return false;

        const WordBoundaryNode* enter = (const WordBoundaryNode*)concatNode->head;
        const LoopNode* loop = (const LoopNode*)concatNode->tail->head;
        const WordBoundaryNode* leave = (const WordBoundaryNode*)concatNode->tail->tail->head;

        if (enter->isNegation ||
            !loop->isGreedy ||
            loop->repeats.lower != 1 ||
            loop->repeats.upper != CharCountFlag ||
            loop->body->tag != Node::MatchSet ||
            leave->isNegation)
            return false;

        const MatchSetNode* wordSet = (const MatchSetNode*)loop->body;

        if (wordSet->isNegation)
            return false;

        return wordSet->set.IsEqualTo(*compiler.standardChars->GetWordSet());
    }